

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenSky.cpp
# Opt level: O2

unsigned_long GetHexId(string *ln)

{
  _Iter_negate<GetHexId(std::__cxx11::string_const&)::__0> *__nptr;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  _Iter_negate<GetHexId(std::__cxx11::string_const&)::__0> *p_Var4;
  _Iter_negate<GetHexId(std::__cxx11::string_const&)::__0> *this;
  
  if (ln->_M_string_length == 6) {
    __nptr = (_Iter_negate<GetHexId(std::__cxx11::string_const&)::__0> *)(ln->_M_dataplus)._M_p;
    this = __nptr;
    for (lVar3 = -1; lVar3 != 0; lVar3 = lVar3 + 1) {
      bVar1 = __gnu_cxx::__ops::_Iter_negate<GetHexId(std::__cxx11::string_const&)::$_0>::operator()
                        (this,in_RSI);
      p_Var4 = this;
      if (bVar1) goto LAB_001773ef;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<GetHexId(std::__cxx11::string_const&)::$_0>::operator()
                        (this + 1,in_RSI);
      p_Var4 = this + 1;
      if (bVar1) goto LAB_001773ef;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<GetHexId(std::__cxx11::string_const&)::$_0>::operator()
                        (this + 2,in_RSI);
      p_Var4 = this + 2;
      if (bVar1) goto LAB_001773ef;
      bVar1 = __gnu_cxx::__ops::_Iter_negate<GetHexId(std::__cxx11::string_const&)::$_0>::operator()
                        (this + 3,in_RSI);
      p_Var4 = this + 3;
      if (bVar1) goto LAB_001773ef;
      this = this + 4;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_negate<GetHexId(std::__cxx11::string_const&)::$_0>::operator()
                      (__nptr + 4,in_RSI);
    if (!bVar1) {
      bVar1 = __gnu_cxx::__ops::_Iter_negate<GetHexId(std::__cxx11::string_const&)::$_0>::operator()
                        (__nptr + 5,in_RSI);
      p_Var4 = __nptr + 5;
      if (!bVar1) {
        p_Var4 = __nptr + 6;
      }
LAB_001773ef:
      if (p_Var4 == __nptr + 6) {
        uVar2 = strtoul((char *)__nptr,(char **)0x0,0x10);
        return uVar2;
      }
    }
  }
  return 0xf000000;
}

Assistant:

unsigned long GetHexId (const std::string& ln)
{
    // must have exactly 6 chars
    if (ln.size() != 6)
        return 0x0F000000UL;
    
    // Test for all hex digits
    if (!std::all_of(ln.begin(),
                     ln.end(),
                     [](const char& ch){ return std::isxdigit(ch); }))
        return 0x0F000000UL;

    // convert text to number
    return std::strtoul(ln.c_str(), nullptr, 16);
}